

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walWriteOneFrame(WalWriter *p,PgHdr *pPage,int nTruncate,sqlite3_int64 iOffset)

{
  u8 local_58 [8];
  u8 aFrame [24];
  void *pData;
  int rc;
  sqlite3_int64 iOffset_local;
  int nTruncate_local;
  PgHdr *pPage_local;
  WalWriter *p_local;
  
  aFrame._16_8_ = pPage->pData;
  walEncodeFrame(p->pWal,pPage->pgno,nTruncate,(u8 *)aFrame._16_8_,local_58);
  p_local._4_4_ = walWriteToLog(p,local_58,0x18,iOffset);
  if (p_local._4_4_ == 0) {
    p_local._4_4_ = walWriteToLog(p,(void *)aFrame._16_8_,p->szPage,iOffset + 0x18);
  }
  return p_local._4_4_;
}

Assistant:

static int walWriteOneFrame(
  WalWriter *p,               /* Where to write the frame */
  PgHdr *pPage,               /* The page of the frame to be written */
  int nTruncate,              /* The commit flag.  Usually 0.  >0 for commit */
  sqlite3_int64 iOffset       /* Byte offset at which to write */
){
  int rc;                         /* Result code from subfunctions */
  void *pData;                    /* Data actually written */
  u8 aFrame[WAL_FRAME_HDRSIZE];   /* Buffer to assemble frame-header in */
#if defined(SQLITE_HAS_CODEC)
  if( (pData = sqlite3PagerCodec(pPage))==0 ) return SQLITE_NOMEM_BKPT;
#else
  pData = pPage->pData;
#endif
  walEncodeFrame(p->pWal, pPage->pgno, nTruncate, pData, aFrame);
  rc = walWriteToLog(p, aFrame, sizeof(aFrame), iOffset);
  if( rc ) return rc;
  /* Write the page data */
  rc = walWriteToLog(p, pData, p->szPage, iOffset+sizeof(aFrame));
  return rc;
}